

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmq.hpp
# Opt level: O0

__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __thiscall
rmq<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_unsigned_long>::
query(rmq<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_unsigned_long>
      *this,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> range_begin,
     __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> range_end)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int *piVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  reference piVar9;
  unsigned_long uVar10;
  reference pvVar11;
  reference pvVar12;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var13;
  ulong uVar14;
  long lVar15;
  int *__n;
  bool bVar16;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1c0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> inblock_min_it_4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1a8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> inblock_min_it_3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_190;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> inblock_min_it_2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_178;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_170;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> block_min_it_2;
  unsigned_long sb_size_offset;
  unsigned_long sb_offset_2;
  uint dist_2;
  unsigned_long right_b_1;
  unsigned_long left_b_2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_130;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> inblock_min_it_1;
  unsigned_long left_gl_idx;
  int *local_118;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_110;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_108;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> block_min_it_1;
  unsigned_long sb_offset_1;
  uint dist_1;
  unsigned_long n_b_1;
  unsigned_long right_b;
  unsigned_long left_b_1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_c8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> inblock_min_it;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_b8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> block_min_it;
  unsigned_long sb_offset;
  uint level;
  unsigned_long n_b;
  unsigned_long left_b_gidx;
  unsigned_long left_b;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> right_sb_min;
  uint dist;
  unsigned_long n_sb;
  unsigned_long right_sb;
  unsigned_long left_sb;
  unsigned_long end_idx;
  unsigned_long begin_idx;
  rmq<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_unsigned_long>
  *this_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> range_end_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> range_begin_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> min_pos;
  
  piVar3 = (int *)std::
                  distance<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                             (this->_begin)._M_current,range_begin);
  piVar4 = (int *)std::
                  distance<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                             (this->_begin)._M_current,range_end);
  if (piVar4 <= piVar3) {
    __assert_fail("begin_idx < end_idx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                  ,0xb5,
                  "Iterator rmq<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<int *, std::vector<int>>, index_t = unsigned long]"
                 );
  }
  if ((int *)this->n < piVar4) {
    __assert_fail("end_idx <= n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                  ,0xb6,
                  "Iterator rmq<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<int *, std::vector<int>>, index_t = unsigned long]"
                 );
  }
  right_sb = ((long)piVar3 - 1U) / this->superblock_size + 1;
  if (piVar3 == (int *)0x0) {
    right_sb = 0;
  }
  uVar5 = (ulong)piVar4 / this->superblock_size;
  range_begin_local._M_current = range_begin._M_current;
  if (right_sb < uVar5) {
    uVar2 = floorlog2<unsigned_long>(uVar5 - right_sb);
    sVar6 = std::
            vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::size(&this->superblock_mins);
    bVar16 = false;
    if (uVar2 < sVar6) {
      pvVar7 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[](&this->superblock_mins,(ulong)uVar2);
      sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar7);
      bVar16 = right_sb < sVar6;
    }
    if (!bVar16) {
      __assert_fail("dist < superblock_mins.size() && left_sb < superblock_mins[dist].size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                    ,0xc9,
                    "Iterator rmq<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<int *, std::vector<int>>, index_t = unsigned long]"
                   );
    }
    pvVar7 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[](&this->superblock_mins,(ulong)uVar2);
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar7,right_sb)
    ;
    right_sb_min = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator+(&this->_begin,*pvVar8);
    range_begin_local._M_current = right_sb_min._M_current;
    sVar6 = std::
            vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::size(&this->superblock_mins);
    bVar16 = false;
    if (uVar2 < sVar6) {
      pvVar7 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[](&this->superblock_mins,(ulong)uVar2);
      sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar7);
      bVar16 = uVar5 - (long)(1 << ((byte)uVar2 & 0x1f)) < sVar6;
    }
    if (!bVar16) {
      __assert_fail("dist < superblock_mins.size() && right_sb - (1<<dist) < superblock_mins[dist].size()"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                    ,0xcb,
                    "Iterator rmq<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<int *, std::vector<int>>, index_t = unsigned long]"
                   );
    }
    pvVar7 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[](&this->superblock_mins,(ulong)uVar2);
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (pvVar7,uVar5 - (long)(1 << ((byte)uVar2 & 0x1f)));
    left_b = (unsigned_long)
             __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                       (&this->_begin,*pvVar8);
    piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&range_begin_local);
    iVar1 = *piVar9;
    piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&left_b
                       );
    if (*piVar9 < iVar1) {
      range_begin_local._M_current = (int *)left_b;
    }
  }
  if (((right_sb <= uVar5) && (right_sb != 0)) &&
     (piVar3 != (int *)(right_sb * this->superblock_size))) {
    lVar15 = ((long)piVar3 - 1U) / this->block_size + 1;
    __n = (int *)(lVar15 * this->block_size);
    lVar15 = lVar15 - (right_sb - 1) * this->n_blocks_per_superblock;
    uVar10 = this->n_blocks_per_superblock - lVar15;
    if (uVar10 != 0) {
      uVar2 = ceillog2<unsigned_long>(uVar10);
      block_min_it._M_current =
           (int *)((right_sb - 1) *
                  (this->n_blocks_per_superblock - (long)((1 << ((byte)uVar2 & 0x1f)) / 2)));
      pvVar11 = std::
                vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                ::operator[](&this->block_mins,(ulong)uVar2);
      pvVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          (pvVar11,lVar15 + (long)block_min_it._M_current);
      inblock_min_it =
           __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                     (&this->_begin,(ulong)*pvVar12);
      local_b8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator+(&inblock_min_it,(right_sb - 1) * this->superblock_size);
      piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_b8);
      iVar1 = *piVar9;
      piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&range_begin_local);
      if (iVar1 < *piVar9) {
        range_begin_local._M_current = local_b8._M_current;
      }
    }
    if (piVar3 < __n) {
      _Var13 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator+(&this->_begin,(difference_type)__n);
      local_c8 = std::
                 min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                           (range_begin,_Var13);
      piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_c8);
      iVar1 = *piVar9;
      piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&range_begin_local);
      if (iVar1 < *piVar9) {
        range_begin_local._M_current = local_c8._M_current;
      }
    }
  }
  if (((right_sb <= uVar5) && (uVar5 != this->n_superblocks)) &&
     (piVar4 != (int *)(uVar5 * this->superblock_size))) {
    lVar15 = uVar5 * this->n_blocks_per_superblock;
    uVar14 = (ulong)piVar4 / this->block_size;
    uVar10 = uVar14 - lVar15;
    if (uVar10 != 0) {
      uVar2 = floorlog2<unsigned_long>(uVar10);
      block_min_it_1._M_current = (int *)(uVar5 * (long)((1 << ((byte)uVar2 & 0x1f)) / 2));
      pvVar11 = std::
                vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                ::operator[](&this->block_mins,(ulong)uVar2);
      pvVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          (pvVar11,lVar15 - (long)block_min_it_1._M_current);
      local_110 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator+(&this->_begin,(ulong)*pvVar12);
      local_108 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator+(&local_110,uVar5 * this->superblock_size);
      piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_108);
      iVar1 = *piVar9;
      piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&range_begin_local);
      if (iVar1 < *piVar9) {
        range_begin_local._M_current = local_108._M_current;
      }
      pvVar11 = std::
                vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                ::operator[](&this->block_mins,(ulong)uVar2);
      pvVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          (pvVar11,(uVar14 - (long)block_min_it_1._M_current) -
                                   (long)(1 << ((byte)uVar2 & 0x1f)));
      left_gl_idx = (unsigned_long)
                    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator+(&this->_begin,(ulong)*pvVar12);
      local_118 = (int *)__gnu_cxx::
                         __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                         operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    *)&left_gl_idx,uVar5 * this->superblock_size);
      local_108 = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_118;
      piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_108);
      iVar1 = *piVar9;
      piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&range_begin_local);
      if (iVar1 < *piVar9) {
        range_begin_local._M_current = local_108._M_current;
      }
    }
    inblock_min_it_1._M_current = (int *)(uVar14 * this->block_size);
    if (inblock_min_it_1._M_current < piVar4) {
      _Var13 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator+(&this->_begin,(difference_type)inblock_min_it_1._M_current);
      local_130 = std::
                  min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                            (_Var13,range_end);
      piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_130);
      iVar1 = *piVar9;
      piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&range_begin_local);
      if (iVar1 < *piVar9) {
        range_begin_local._M_current = local_130._M_current;
      }
    }
  }
  if (uVar5 < right_sb) {
    right_b_1 = ((long)piVar3 - 1U) / this->block_size + 1;
    if (piVar3 == (int *)0x0) {
      right_b_1 = 0;
    }
    uVar5 = (ulong)piVar4 / this->block_size;
    if (right_b_1 < uVar5) {
      if (right_b_1 / this->n_blocks_per_superblock != uVar5 / this->n_blocks_per_superblock) {
        __assert_fail("left_b / n_blocks_per_superblock == right_b / n_blocks_per_superblock",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                      ,0x114,
                      "Iterator rmq<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<int *, std::vector<int>>, index_t = unsigned long]"
                     );
      }
      uVar2 = floorlog2<unsigned_long>(uVar5 - right_b_1);
      sb_size_offset = 0;
      block_min_it_2._M_current = (int *)0x0;
      if (1 < right_sb) {
        sb_size_offset = (right_sb - 1) * (long)((1 << ((byte)uVar2 & 0x1f)) / 2);
        block_min_it_2._M_current = (int *)((right_sb - 1) * this->superblock_size);
      }
      pvVar11 = std::
                vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                ::operator[](&this->block_mins,(ulong)uVar2);
      pvVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          (pvVar11,right_b_1 - sb_size_offset);
      local_178 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator+(&this->_begin,(ulong)*pvVar12);
      local_170 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator+(&local_178,block_min_it_2._M_current);
      piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_170);
      iVar1 = *piVar9;
      piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&range_begin_local);
      if (iVar1 < *piVar9) {
        range_begin_local._M_current = local_170._M_current;
      }
      pvVar11 = std::
                vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                ::operator[](&this->block_mins,(ulong)uVar2);
      pvVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          (pvVar11,(uVar5 - sb_size_offset) - (long)(1 << ((byte)uVar2 & 0x1f)));
      inblock_min_it_2 =
           __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                     (&this->_begin,(ulong)*pvVar12);
      local_170 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator+(&inblock_min_it_2,block_min_it_2._M_current);
      piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_170);
      iVar1 = *piVar9;
      piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&range_begin_local);
      if (iVar1 < *piVar9) {
        range_begin_local._M_current = local_170._M_current;
      }
      if (piVar3 < (int *)(right_b_1 * this->block_size)) {
        inblock_min_it_3 =
             __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                       (&this->_begin,right_b_1 * this->block_size);
        local_190 = std::
                    min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                              (range_begin,inblock_min_it_3);
        piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_190);
        iVar1 = *piVar9;
        piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&range_begin_local);
        if (iVar1 < *piVar9) {
          range_begin_local._M_current = local_190._M_current;
        }
      }
      if ((int *)(uVar5 * this->block_size) < piVar4) {
        _Var13 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator+(&this->_begin,uVar5 * this->block_size);
        inblock_min_it_4 = range_end;
        local_1a8 = std::
                    min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                              (_Var13,range_end);
        piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_1a8);
        iVar1 = *piVar9;
        piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&range_begin_local);
        if (iVar1 < *piVar9) {
          range_begin_local._M_current = local_1a8._M_current;
        }
      }
    }
    else {
      local_1c0 = std::
                  min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                            (range_begin,range_end);
      piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_1c0);
      iVar1 = *piVar9;
      piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&range_begin_local);
      if (iVar1 < *piVar9) {
        range_begin_local._M_current = local_1c0._M_current;
      }
    }
  }
  return (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
         range_begin_local._M_current;
}

Assistant:

Iterator query(Iterator range_begin, Iterator range_end) {
        // find superblocks fully contained within range
        index_t begin_idx = std::distance(_begin, range_begin);
        index_t end_idx = std::distance(_begin, range_end);
        assert(begin_idx < end_idx);
        assert(end_idx <= n);

        // round up to next superblock
        index_t left_sb  = (begin_idx - 1) / superblock_size + 1;
        if (begin_idx == 0)
            left_sb = 0;
        // round down to prev superblock
        index_t right_sb = end_idx / superblock_size;

        // init result
        Iterator min_pos = range_begin;

        // if there is at least one superblock
        if (left_sb < right_sb) {
            // get largest power of two that doesn't exceed the number of
            // superblocks from (left,right)
            index_t n_sb = right_sb - left_sb;
            unsigned int dist = floorlog2(n_sb);

            assert(dist < superblock_mins.size() && left_sb < superblock_mins[dist].size());
            min_pos = _begin + superblock_mins[dist][left_sb];
            assert(dist < superblock_mins.size() && right_sb - (1<<dist) < superblock_mins[dist].size());
            Iterator right_sb_min = _begin + superblock_mins[dist][right_sb - (1 << dist)];
            if (*min_pos > *right_sb_min) {
                min_pos = right_sb_min;
            }
        }

        // go to left -> blocks -> sub-block
        if (left_sb <= right_sb && left_sb != 0 && begin_idx != left_sb*superblock_size) {
            index_t left_b = (begin_idx - 1) / block_size + 1;
            index_t left_b_gidx = left_b * block_size;
            left_b -= (left_sb - 1)*n_blocks_per_superblock;
            index_t n_b = n_blocks_per_superblock - left_b;
            if (n_b > 0) {
                unsigned int level = ceillog2(n_b);
                index_t sb_offset = (left_sb-1)*(n_blocks_per_superblock - (1<<level)/2);
                Iterator block_min_it = _begin + block_mins[level][left_b + sb_offset] + (left_sb-1)*superblock_size;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
            }

            // go left into remaining block, if elements left
            if (left_b_gidx > begin_idx) {
                // linearly search (at most block_size elements)
                Iterator inblock_min_it = std::min_element(range_begin, _begin + left_b_gidx);
                if (*inblock_min_it < *min_pos) {
                    min_pos = inblock_min_it;
                }
            }
        }

        // go to right -> blocks -> sub-block
        if (left_sb <= right_sb && right_sb != n_superblocks && end_idx != right_sb*superblock_size) {
            index_t left_b = right_sb*n_blocks_per_superblock;
            index_t right_b = end_idx / block_size;
            index_t n_b = right_b - left_b;
            if (n_b > 0) {
                unsigned int dist = floorlog2(n_b);
                index_t sb_offset = right_sb*((1<<dist)/2);
                Iterator block_min_it = _begin + block_mins[dist][left_b - sb_offset] + (right_sb)*superblock_size;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
                block_min_it = _begin + block_mins[dist][right_b - sb_offset - (1<<dist)] + (right_sb)*superblock_size;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
            }

            // go right into remaining block, if elements left
            index_t left_gl_idx = right_b*block_size;
            if (left_gl_idx < end_idx) {
                // linearly search (at most block_size elements)
                Iterator inblock_min_it = std::min_element(_begin + left_gl_idx, range_end);
                if (*inblock_min_it < *min_pos) {
                    min_pos = inblock_min_it;
                }
            }
        }

        // if there are no superblocks covered (both indeces in same superblock)
        if (left_sb > right_sb) {
            index_t left_b = (begin_idx - 1) / block_size + 1;
            if (begin_idx == 0)
                left_b = 0;
            index_t right_b = end_idx / block_size;


            if (left_b < right_b) {
                // if blocks are in between: get mins of blocks in range
                // NOTE: there was a while if-else block here to handle the
                //       case if blocks would span accross the boundary of two
                //       superblocks, this should however never happen
                //       git blame this line to find where this code was removed
                // assert blocks lie in the same superblock
                assert(left_b / n_blocks_per_superblock == right_b / n_blocks_per_superblock);

                unsigned int dist = floorlog2(right_b - left_b);
                index_t sb_offset = 0;
                index_t sb_size_offset = 0;
                if (left_sb > 1) {
                    sb_offset = (left_sb-1)*((1<<dist)/2);
                    sb_size_offset = (left_sb-1)*superblock_size;
                }
                Iterator block_min_it = _begin + block_mins[dist][left_b - sb_offset] + sb_size_offset;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
                block_min_it = _begin + block_mins[dist][right_b - sb_offset - (1<<dist)] + sb_size_offset;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;

                // remaining inblock
                if (begin_idx < left_b*block_size) {
                    Iterator inblock_min_it = std::min_element(range_begin, _begin + left_b*block_size);
                    if (*inblock_min_it < *min_pos) {
                        min_pos = inblock_min_it;
                    }
                }
                if (end_idx > right_b*block_size) {
                    Iterator inblock_min_it = std::min_element(_begin + right_b*block_size, range_end);
                    if (*inblock_min_it < *min_pos) {
                        min_pos = inblock_min_it;
                    }
                }
            } else {
                // no blocks at all
                Iterator inblock_min_it = std::min_element(range_begin, range_end);
                if (*inblock_min_it < *min_pos) {
                    min_pos = inblock_min_it;
                }
            }

        }

        // return the minimum found
        return min_pos;
    }